

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Acb_MfsStop(Acb_Mfs_t *p)

{
  Vec_Int_t *pVVar1;
  
  pVVar1 = p->vFlip;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vSupp;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vValues;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  sat_solver_delete(p->pSat[0]);
  sat_solver_delete(p->pSat[1]);
  sat_solver_delete(p->pSat[2]);
  if (p != (Acb_Mfs_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Acb_MfsStop( Acb_Mfs_t * p )
{
    Vec_IntFree( p->vFlip );
    Vec_IntFree( p->vSupp );
    Vec_IntFree( p->vValues );
    sat_solver_delete( p->pSat[0] );
    sat_solver_delete( p->pSat[1] );
    sat_solver_delete( p->pSat[2] );
    ABC_FREE( p );
}